

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_landscapes.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  char **__args;
  vector<const_char_*,_std::allocator<const_char_*>_> filenames;
  Persistence_landscape l;
  stringstream ss;
  char **local_228;
  iterator iStack_220;
  char **local_218;
  ulong local_208;
  long *local_200;
  long local_1f0 [2];
  Persistence_landscape local_1e0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "This program creates persistence landscapes files (*.land) of persistence diagrams files (*.pers) "
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"provided as an input.\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "The first parameter of this program is a dimension of persistence that will be used in creation of "
             ,99);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"the persistence heat maps.",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "If your input files contains persistence pairs of various dimension, as a first parameter of the "
             ,0x61);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "procedure please provide the dimension of persistence you want to use.",0x46);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "If in your files there are only birth-death pairs of the same dimension, set the first parameter to "
             ,100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"-1.\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "The remaining parameters are the names of files with persistence diagrams. \n",0x4c);
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Wrong parameter list, the program will now terminate \n",0x36)
    ;
    iVar2 = 1;
  }
  else {
    local_228 = (char **)0x0;
    iStack_220._M_current = (char **)0x0;
    local_218 = (char **)0x0;
    uVar3 = atoi(argv[1]);
    uVar5 = 0xffffffff;
    if (-1 < (int)uVar3) {
      uVar5 = uVar3;
    }
    __args = argv + 2;
    lVar6 = (ulong)(uint)argc - 2;
    do {
      if (iStack_220._M_current == local_218) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_228,iStack_220,__args);
      }
      else {
        *iStack_220._M_current = *__args;
        iStack_220._M_current = iStack_220._M_current + 1;
      }
      __args = __args + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    if (iStack_220._M_current != local_228) {
      local_208 = (ulong)uVar5;
      lVar6 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,"Creating a landscape based on file : ",0x25);
        pcVar1 = local_228[lVar6];
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::clog + -0x18) + 0x10e038);
        }
        else {
          sVar4 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,pcVar1,sVar4);
        }
        std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
        Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
                  (&local_1e0,local_228[lVar6],local_208,0xffffffffffffffff);
        std::__cxx11::stringstream::stringstream(local_1b8);
        pcVar1 = local_228[lVar6];
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
        }
        else {
          sVar4 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".land",5);
        std::__cxx11::stringbuf::str();
        Gudhi::Persistence_representations::Persistence_landscape::print_to_file
                  (&local_1e0,(char *)local_200);
        if (local_200 != local_1f0) {
          operator_delete(local_200,local_1f0[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        std::
        vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
        ::~vector(&local_1e0.land);
        lVar6 = lVar6 + 1;
      } while (lVar6 != (long)iStack_220._M_current - (long)local_228 >> 3);
    }
    if (local_228 != (char **)0x0) {
      operator_delete(local_228,(long)local_218 - (long)local_228);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program creates persistence landscapes files (*.land) of persistence diagrams files (*.pers) "
            << "provided as an input.\n"
            << "The first parameter of this program is a dimension of persistence that will be used in creation of "
            << "the persistence heat maps."
            << "If your input files contains persistence pairs of various dimension, as a first parameter of the "
            << "procedure please provide the dimension of persistence you want to use."
            << "If in your files there are only birth-death pairs of the same dimension, set the first parameter to "
            << "-1.\n"
            << "The remaining parameters are the names of files with persistence diagrams. \n";

  if (argc < 3) {
    std::clog << "Wrong parameter list, the program will now terminate \n";
    return 1;
  }
  std::vector<const char*> filenames;
  int dim = atoi(argv[1]);
  unsigned dimension = std::numeric_limits<unsigned>::max();
  if (dim >= 0) {
    dimension = (unsigned)dim;
  }
  for (int i = 2; i < argc; ++i) {
    filenames.push_back(argv[i]);
  }

  for (size_t i = 0; i != filenames.size(); ++i) {
    std::clog << "Creating a landscape based on file : " << filenames[i] << std::endl;
    Persistence_landscape l(filenames[i], dimension);
    std::stringstream ss;
    ss << filenames[i] << ".land";
    l.print_to_file(ss.str().c_str());
  }
  return 0;
}